

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tcg_exec_init_m68k(uc_struct_conflict3 *uc,uint32_t tb_size)

{
  uint uVar1;
  TCGContext_conflict2 *pTVar2;
  void *addr;
  void **ppvVar3;
  size_t size;
  size_t __len;
  
  pTVar2 = (TCGContext_conflict2 *)g_malloc(0x9750);
  uc->tcg_ctx = pTVar2;
  tcg_context_init_m68k(pTVar2);
  uc->tcg_ctx->uc = uc;
  page_size_init_m68k(uc);
  uc->v_l1_size = 0x400;
  uc->v_l1_shift = 10;
  uc->v_l2_levels = 0;
  qht_init(&(uc->tcg_ctx->tb_ctx).htable,tb_cmp,0x8000,1);
  pTVar2 = uc->tcg_ctx;
  uVar1 = 0x100000;
  if (0x100000 < tb_size) {
    uVar1 = tb_size;
  }
  if (0x7fffffff < uVar1) {
    uVar1 = 0x80000000;
  }
  __len = 0x40000000;
  if (tb_size != 0) {
    __len = (size_t)uVar1;
  }
  pTVar2->code_gen_buffer_size = __len;
  addr = mmap64((void *)0x0,__len,7,0x22,-1,0);
  if (addr == (void *)0xffffffffffffffff) {
    pTVar2->code_gen_buffer = (void *)0x0;
    pTVar2->initial_buffer = (void *)0x0;
    pTVar2->initial_buffer_size = pTVar2->code_gen_buffer_size;
    uc->tcg_buffer_size = (uint32_t)pTVar2->code_gen_buffer_size;
  }
  else {
    qemu_madvise(addr,__len,0xe);
    pTVar2->code_gen_buffer = addr;
    pTVar2->initial_buffer = addr;
    pTVar2->initial_buffer_size = pTVar2->code_gen_buffer_size;
    uc->tcg_buffer_size = (uint32_t)pTVar2->code_gen_buffer_size;
    if (addr != (void *)0x0) {
      tcg_prologue_init_m68k(uc->tcg_ctx);
      ppvVar3 = (void **)g_malloc0(0x10000);
      uc->l1_map = ppvVar3;
      uc->uc_invalidate_tb = uc_invalidate_tb;
      uc->uc_gen_tb = uc_gen_tb;
      uc->tb_flush_m68k = uc_tb_flush;
      uc->add_inline_hook = uc_add_inline_hook_m68k;
      uc->del_inline_hook = uc_del_inline_hook_m68k;
      return;
    }
  }
  tcg_exec_init_m68k_cold_1();
  return;
}

Assistant:

void tcg_exec_init(struct uc_struct *uc, uint32_t tb_size)
{
    /* remove tcg object. init here. */
    /* tcg class init: tcg-all.c:tcg_accel_class_init(), skip all. */
    /* tcg object init: tcg-all.c:tcg_accel_instance_init(), skip all. */
    /* tcg init: tcg-all.c: tcg_init(), skip all. */
    /* run tcg_exec_init() here. */
    uc->tcg_ctx = g_malloc(sizeof(TCGContext));
    tcg_context_init(uc->tcg_ctx);
    uc->tcg_ctx->uc = uc;
    page_init(uc);
    tb_htable_init(uc);
    code_gen_alloc(uc, tb_size);
    tb_exec_unlock(uc->tcg_ctx);
    tcg_prologue_init(uc->tcg_ctx);
    /* cpu_interrupt_handler is not used in uc1 */
    uc->l1_map = g_malloc0(sizeof(void *) * V_L1_MAX_SIZE);
    /* Invalidate / Cache TBs */
    uc->uc_invalidate_tb = uc_invalidate_tb;
    uc->uc_gen_tb = uc_gen_tb;
    uc->tb_flush = uc_tb_flush;

    /* Inline hooks optimization */
    uc->add_inline_hook = uc_add_inline_hook;
    uc->del_inline_hook = uc_del_inline_hook;
}